

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

MessageOptions * __thiscall
google::protobuf::DescriptorProto::mutable_options(DescriptorProto *this)

{
  MessageOptions *this_00;
  
  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
  if (this->options_ == (MessageOptions *)0x0) {
    this_00 = (MessageOptions *)operator_new(0x68);
    MessageOptions::MessageOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::MessageOptions* DescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) options_ = new ::google::protobuf::MessageOptions;
  return options_;
}